

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlnumber.c
# Opt level: O0

err_t ReadDataFloat(ebml_float *Element,stream *Input,ebml_parser_context *ParserContext,
                   bool_t AllowDummyElt,int Scope,size_t DepthCheckCRC)

{
  code *pcVar1;
  filepos_t fVar2;
  long lVar3;
  filepos_t local_90;
  anon_union_8_2_947300a4 data_1;
  ebml_float *peStack_50;
  anon_union_4_2_947300a4 data;
  err_t Result;
  uint8_t Value [8];
  size_t DepthCheckCRC_local;
  int Scope_local;
  bool_t AllowDummyElt_local;
  ebml_parser_context *ParserContext_local;
  stream *Input_local;
  ebml_float *Element_local;
  
  Value = (uint8_t  [8])DepthCheckCRC;
  if (((Element->Base).DataSize != 8) && ((Element->Base).DataSize != 4)) {
    __assert_fail("Element->Base.DataSize == 8 || Element->Base.DataSize == 4",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlnumber.c"
                  ,0xd2,
                  "err_t ReadDataFloat(ebml_float *, struct stream *, const ebml_parser_context *, bool_t, int, size_t)"
                 );
  }
  (Element->Base).bValueIsSet = '\0';
  if (Scope == 2) {
    Element_local = (ebml_float *)0x0;
  }
  else {
    if (Input == (stream *)0x0) {
      __assert_fail("(const void*)(Input)!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlnumber.c"
                    ,0xd9,
                    "err_t ReadDataFloat(ebml_float *, struct stream *, const ebml_parser_context *, bool_t, int, size_t)"
                   );
    }
    pcVar1 = *(code **)((long)(Input->Base).VMT + 0x78);
    fVar2 = EBML_ElementPositionData(&Element->Base);
    lVar3 = (*pcVar1)(Input,fVar2,0);
    if (lVar3 == -1) {
      peStack_50 = (ebml_float *)0xffffffffffffffeb;
    }
    else if (((Element->Base).DataSize == 8) || ((Element->Base).DataSize == 4)) {
      if (Input == (stream *)0x0) {
        __assert_fail("(const void*)(Input)!=NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlnumber.c"
                      ,0xe4,
                      "err_t ReadDataFloat(ebml_float *, struct stream *, const ebml_parser_context *, bool_t, int, size_t)"
                     );
      }
      if ((ulong)(Element->Base).DataSize < 9) {
        local_90 = (Element->Base).DataSize;
      }
      else {
        local_90 = 8;
      }
      peStack_50 = (ebml_float *)
                   (**(code **)((long)(Input->Base).VMT + 0x58))(Input,&Result,local_90,0);
      if (peStack_50 == (ebml_float *)0x0) {
        if ((Element->Base).DataSize == 4) {
          Element->Value =
               (double)(float)((uint)(byte)Result << 0x18 | (uint)Result._1_1_ << 0x10 |
                               (uint)Result._2_1_ << 8 | (uint)Result._3_1_);
          (Element->Base).bValueIsSet = '\x01';
        }
        else if ((Element->Base).DataSize == 8) {
          Element->Value =
               (double)((ulong)(byte)Result << 0x38 | (ulong)Result._1_1_ << 0x30 |
                        (ulong)Result._2_1_ << 0x28 | (ulong)Result._3_1_ << 0x20 |
                        (ulong)Result._4_1_ << 0x18 | (ulong)Result._5_1_ << 0x10 |
                        (ulong)Result._6_1_ << 8 | (ulong)Result._7_1_);
          (Element->Base).bValueIsSet = '\x01';
        }
        else {
          peStack_50 = (ebml_float *)0xfffffffffffffffc;
        }
      }
    }
    else {
      peStack_50 = (ebml_float *)0xfffffffffffffffd;
    }
    Element_local = peStack_50;
  }
  return (err_t)Element_local;
}

Assistant:

static err_t ReadDataFloat(ebml_float *Element, struct stream *Input, const ebml_parser_context *UNUSED_PARAM(ParserContext), bool_t UNUSED_PARAM(AllowDummyElt), int Scope, size_t UNUSED_PARAM(DepthCheckCRC))
{
    uint8_t Value[8];
    err_t Result;

    assert(Element->Base.DataSize == 8 || Element->Base.DataSize == 4);

    Element->Base.bValueIsSet = 0;

    if (Scope == SCOPE_NO_DATA)
        return ERR_NONE;

    if (Stream_Seek(Input,EBML_ElementPositionData((ebml_element*)Element),SEEK_SET)==INVALID_FILEPOS_T)
    {
        Result = ERR_READ;
        goto failed;
    }
    if (Element->Base.DataSize != 8 && Element->Base.DataSize != 4)
    {
        Result = ERR_INVALID_DATA;
        goto failed;
    }

    Result = Stream_Read(Input,Value,MIN((size_t)Element->Base.DataSize,sizeof(Value)),NULL); // min is for code safety
    if (Result != ERR_NONE)
        goto failed;

    if (Element->Base.DataSize == 4) {
        union {
            float f;
            uint32_t i;
        } data;
        data.i = LOAD32BE(Value);
        Element->Value = data.f;
        Element->Base.bValueIsSet = 1;
    } else if (Element->Base.DataSize == 8) {
        union {
            double f;
            uint64_t i;
        } data;
        data.i = LOAD64BE(Value);
        Element->Value = data.f;
        Element->Base.bValueIsSet = 1;
    } else
        Result = ERR_INVALID_PARAM;
failed:
    return Result;
}